

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_compute_pipeline_handle
          (Impl *this,VkPipeline pipeline,VkPipeline *out_pipeline)

{
  bool bVar1;
  const_iterator cVar2;
  long *in_FS_OFFSET;
  VkPipeline pipeline_local;
  
  pipeline_local = pipeline;
  cVar2 = std::
          _Hashtable<VkPipeline_T_*,_std::pair<VkPipeline_T_*const,_unsigned_long>,_std::allocator<std::pair<VkPipeline_T_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<VkPipeline_T_*>,_std::hash<VkPipeline_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->compute_pipeline_to_hash)._M_h,&pipeline_local);
  if (cVar2.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>._M_cur
      == (__node_type *)0x0) {
    if (*(int *)(*in_FS_OFFSET + -0x18) < 2) {
      bVar1 = Internal::log_thread_callback
                        (LOG_DEFAULT,
                         "Cannot find compute pipeline in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                        );
      if (!bVar1) {
        fwrite("Fossilize WARN: Cannot find compute pipeline in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
               ,0x84,1,_stderr);
      }
    }
  }
  else {
    *out_pipeline =
         *(VkPipeline *)
          ((long)cVar2.
                 super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>.
                 _M_cur + 0x10);
  }
  return cVar2.super__Node_iterator_base<std::pair<VkPipeline_T_*const,_unsigned_long>,_false>.
         _M_cur != (__node_type *)0x0;
}

Assistant:

bool StateRecorder::Impl::remap_compute_pipeline_handle(VkPipeline pipeline, VkPipeline *out_pipeline) const
{
	auto itr = compute_pipeline_to_hash.find(pipeline);
	if (itr == end(compute_pipeline_to_hash))
	{
		LOGW_LEVEL("Cannot find compute pipeline in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_pipeline = api_object_cast<VkPipeline>(uint64_t(itr->second));
		return true;
	}
}